

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

void __thiscall kj::VectorOutputStream::~VectorOutputStream(VectorOutputStream *this)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__VectorOutputStream_00280548;
  puVar1 = (this->vector).ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->vector).size_;
    (this->vector).ptr = (uchar *)0x0;
    (this->vector).size_ = 0;
    pAVar3 = (this->vector).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

VectorOutputStream::~VectorOutputStream() noexcept(false) {}